

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis,float angle)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  rf_vec3 rVar4;
  rf_quaternion rVar5;
  undefined4 local_18;
  undefined4 uStack_14;
  
  uVar1 = -(uint)(SQRT(axis.z * axis.z + axis.x * axis.x + axis.y * axis.y) != 0.0);
  fVar3 = (float)(~uVar1 & (uint)angle | (uint)(angle * 0.5) & uVar1);
  rVar4 = rf_vec3_normalize(axis);
  fVar2 = sinf(fVar3);
  fVar3 = cosf(fVar3);
  rVar5.z = rVar4.z * fVar2;
  local_18 = rVar4.x;
  uStack_14 = rVar4.y;
  rVar5.y = fVar2 * uStack_14;
  rVar5.x = fVar2 * local_18;
  rVar5.w = fVar3;
  rVar5 = rf_quaternion_normalize(rVar5);
  return rVar5;
}

Assistant:

RF_API rf_quaternion rf_quaternion_from_axis_angle(rf_vec3 axis, float angle)
{
    rf_quaternion result = {0.0f, 0.0f, 0.0f, 1.0f};

    if (rf_vec3_len(axis) != 0.0f)

        angle *= 0.5f;

    axis = rf_vec3_normalize(axis);

    float sinres = sinf(angle);
    float cosres = cosf(angle);

    result.x = axis.x * sinres;
    result.y = axis.y * sinres;
    result.z = axis.z * sinres;
    result.w = cosres;

    result = rf_quaternion_normalize(result);

    return result;
}